

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O3

void __thiscall ParserTestPhonySelfReferenceIgnored::Run(ParserTestPhonySelfReferenceIgnored *this)

{
  int iVar1;
  bool bVar2;
  Node *pNVar3;
  int iVar4;
  StringPiece path;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse(&this->super_ParserTest,"build a: phony a\n");
  iVar4 = g_current_test->assertion_failures_;
  if (iVar1 == iVar4) {
    path.len_ = 1;
    path.str_ = "a";
    pNVar3 = State::LookupNode(&(this->super_ParserTest).state,path);
    bVar2 = testing::Test::Check
                      (g_current_test,
                       (pNVar3->in_edge_->inputs_).
                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_start ==
                       (pNVar3->in_edge_->inputs_).
                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x18c,"edge->inputs_.empty()");
    if (bVar2) {
      return;
    }
    iVar4 = g_current_test->assertion_failures_;
  }
  g_current_test->assertion_failures_ = iVar4 + 1;
  return;
}

Assistant:

TEST_F(ParserTest, PhonySelfReferenceIgnored) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"build a: phony a\n"
));

  Node* node = state.LookupNode("a");
  Edge* edge = node->in_edge();
  ASSERT_TRUE(edge->inputs_.empty());
}